

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O1

int ffpbyt(fitsfile *fptr,LONGLONG nbytes,void *buffer,int *status)

{
  LONGLONG *pLVar1;
  FITSfile *pFVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  size_t __n;
  long local_50;
  
  if (*status < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (fptr->Fptr->curbuf < 0) {
      ffldrc(fptr,fptr->Fptr->bytepos / 0xb40,0,status);
    }
    if (nbytes < 0x21c0) {
      if (nbytes != 0) {
        pFVar2 = fptr->Fptr;
        lVar5 = pFVar2->bufrecnum[pFVar2->curbuf] * -0xb40 + pFVar2->bytepos;
        sVar8 = 0xb40 - lVar5;
        do {
          __n = sVar8;
          if (nbytes < (long)sVar8) {
            __n = nbytes;
          }
          memcpy(fptr->Fptr->iobuffer + lVar5 + (long)fptr->Fptr->curbuf * 0xb40,buffer,__n);
          pFVar2 = fptr->Fptr;
          lVar4 = pFVar2->bytepos + __n;
          pFVar2->bytepos = lVar4;
          pFVar2->dirty[pFVar2->curbuf] = 1;
          nbytes = nbytes - __n;
          if (nbytes != 0) {
            ffldrc(fptr,lVar4 / 0xb40,1,status);
            sVar8 = 0xb40;
            lVar5 = 0;
          }
          buffer = (void *)((long)buffer + __n);
        } while (nbytes != 0);
      }
    }
    else {
      pFVar2 = fptr->Fptr;
      iVar6 = pFVar2->curbuf;
      lVar7 = (long)iVar6;
      local_50 = pFVar2->bytepos;
      lVar5 = pFVar2->bufrecnum[lVar7];
      lVar4 = (nbytes + local_50 + -1) / 0xb40;
      lVar3 = lVar5 * -0xb40 + local_50;
      if (lVar3 != 0xb40) {
        sVar8 = 0xb40 - lVar3;
        memcpy(pFVar2->iobuffer + lVar3 + iVar6 * 0xb40,buffer,sVar8);
        nbytes = nbytes - sVar8;
        buffer = (void *)((long)buffer + sVar8);
        local_50 = local_50 + sVar8;
        fptr->Fptr->dirty[lVar7] = 1;
      }
      lVar3 = 0;
      do {
        pFVar2 = fptr->Fptr;
        if ((lVar5 <= pFVar2->bufrecnum[lVar3]) && (pFVar2->bufrecnum[lVar3] <= lVar4)) {
          if (pFVar2->dirty[lVar3] != 0) {
            ffbfwt(pFVar2,(int)lVar3,status);
          }
          fptr->Fptr->bufrecnum[lVar3] = -1;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x28);
      if (fptr->Fptr->io_pos != local_50) {
        ffseek(fptr->Fptr,local_50);
      }
      lVar5 = (nbytes + -1) / 0xb40;
      lVar3 = lVar5 * 0xb40;
      ffwrite(fptr->Fptr,lVar3,buffer,status);
      lVar9 = lVar3 + local_50;
      pFVar2 = fptr->Fptr;
      pFVar2->io_pos = lVar9;
      if (lVar9 < pFVar2->filesize) {
        ffread(pFVar2,0xb40,pFVar2->iobuffer + iVar6 * 0xb40,status);
        pLVar1 = &fptr->Fptr->io_pos;
        *pLVar1 = *pLVar1 + 0xb40;
      }
      else {
        pFVar2->filesize = lVar9;
        if (pFVar2->hdutype == 1) {
          iVar6 = 0x20;
        }
        else {
          iVar6 = 0;
        }
        memset(pFVar2->iobuffer + lVar7 * 0xb40,iVar6,0xb40);
      }
      memcpy(fptr->Fptr->iobuffer + lVar7 * 0xb40,(void *)((long)buffer + lVar3),
             nbytes + lVar5 * -0xb40);
      pFVar2 = fptr->Fptr;
      pFVar2->dirty[lVar7] = 1;
      pFVar2->bufrecnum[lVar7] = lVar4;
      lVar5 = lVar4 * 0xb40 + 0xb40;
      if (lVar5 < pFVar2->logfilesize) {
        lVar5 = pFVar2->logfilesize;
      }
      pFVar2->logfilesize = lVar5;
      pFVar2->bytepos = nbytes + local_50;
    }
    return *status;
  }
  return *status;
}

Assistant:

int ffpbyt(fitsfile *fptr,   /* I - FITS file pointer                    */
           LONGLONG nbytes,      /* I - number of bytes to write             */
           void *buffer,     /* I - buffer containing the bytes to write */
           int *status)      /* IO - error status                        */
/*
  put (write) the buffer of bytes to the output FITS file, starting at
  the current file position.  Write large blocks of data directly to disk;
  write smaller segments to intermediate IO buffers to improve efficiency.
*/
{
    int ii, nbuff;
    LONGLONG filepos;
    long recstart, recend;
    long ntodo, bufpos, nspace, nwrite;
    char *cptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nbytes > LONG_MAX) {
        ffpmsg("Number of bytes to write is greater than LONG_MAX (ffpbyt).");
        *status = WRITE_ERROR;
	return(*status);
    }
    
    ntodo =  (long) nbytes;
    cptr = (char *)buffer;

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    if (nbytes >= MINDIRECT)
    {
      /* write large blocks of data directly to disk instead of via buffers */
      /* first, fill up the current IO buffer before flushing it to disk */

      nbuff = (fptr->Fptr)->curbuf;      /* current IO buffer number */
      filepos = (fptr->Fptr)->bytepos;   /* save the write starting position */
      recstart = (fptr->Fptr)->bufrecnum[nbuff];                 /* starting record */
      recend = (long) ((filepos + nbytes - 1) / IOBUFLEN);  /* ending record   */

      /* bufpos is the starting position within the IO buffer */
      bufpos = (long) (filepos - ((LONGLONG)recstart * IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      if (nspace)
      { /* fill up the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN) + bufpos, cptr, nspace);
        ntodo -= nspace;           /* decrement remaining number of bytes */
        cptr += nspace;            /* increment user buffer pointer */
        filepos += nspace;         /* increment file position pointer */
        (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      }

      for (ii = 0; ii < NIOBUF; ii++) /* flush any affected buffers to disk */
      {
        if ((fptr->Fptr)->bufrecnum[ii] >= recstart
            && (fptr->Fptr)->bufrecnum[ii] <= recend )
        {
          if ((fptr->Fptr)->dirty[ii])        /* flush modified buffer to disk */
             ffbfwt(fptr->Fptr, ii, status);

          (fptr->Fptr)->bufrecnum[ii] = -1;  /* disassociate buffer from the file */
        }
      }

      /* move to the correct write position */
      if ((fptr->Fptr)->io_pos != filepos)
         ffseek(fptr->Fptr, filepos);

      nwrite = ((ntodo - 1) / IOBUFLEN) * IOBUFLEN; /* don't write last buff */

      ffwrite(fptr->Fptr, nwrite, cptr, status); /* write the data */
      ntodo -= nwrite;                /* decrement remaining number of bytes */
      cptr += nwrite;                  /* increment user buffer pointer */
      (fptr->Fptr)->io_pos = filepos + nwrite; /* update the file position */

      if ((fptr->Fptr)->io_pos >= (fptr->Fptr)->filesize) /* at the EOF? */
      {
        (fptr->Fptr)->filesize = (fptr->Fptr)->io_pos; /* increment file size */

        /* initialize the current buffer with the correct fill value */
        if ((fptr->Fptr)->hdutype == ASCII_TBL)
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), 32, IOBUFLEN);  /* blank fill */
        else
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN),  0, IOBUFLEN);  /* zero fill */
      }
      else
      {
        /* read next record */
        ffread(fptr->Fptr, IOBUFLEN, (fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), status);
        (fptr->Fptr)->io_pos += IOBUFLEN; 
      }

      /* copy remaining bytes from user buffer into current IO buffer */
      memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), cptr, ntodo);
      (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      (fptr->Fptr)->bufrecnum[nbuff] = recend; /* record number */

      (fptr->Fptr)->logfilesize = maxvalue((fptr->Fptr)->logfilesize, 
                                       (LONGLONG)(recend + 1) * IOBUFLEN);
      (fptr->Fptr)->bytepos = filepos + nwrite + ntodo;
    }
    else
    {
      /* bufpos is the starting position in IO buffer */
      bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)(fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf] *
               IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      while (ntodo)
      {
        nwrite = minvalue(ntodo, nspace);

        /* copy bytes from user's buffer to the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + ((fptr->Fptr)->curbuf * IOBUFLEN) + bufpos, cptr, nwrite);
        ntodo -= nwrite;            /* decrement remaining number of bytes */
        cptr += nwrite;
        (fptr->Fptr)->bytepos += nwrite;  /* increment file position pointer */
        (fptr->Fptr)->dirty[(fptr->Fptr)->curbuf] = TRUE; /* mark record as modified */

        if (ntodo)                  /* load next record into a buffer */
        {
          ffldrc(fptr, (long) ((fptr->Fptr)->bytepos / IOBUFLEN), IGNORE_EOF, status);
          bufpos = 0;
          nspace = IOBUFLEN;
        }
      }
    }
    return(*status);
}